

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  InternalKeyComparator *pIVar1;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *p_Var2;
  Snapshot *pSVar3;
  size_type sVar4;
  FileMetaData *pFVar5;
  int iVar6;
  pointer ppFVar7;
  Iterator *pIVar8;
  uint64_t uVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  Table *tableptr;
  uint64_t local_80;
  Table *local_58;
  size_type local_50;
  pointer local_48;
  Snapshot *pSStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = &this->icmp_;
  lVar10 = 0;
  local_80 = 0;
  do {
    ppFVar7 = v->files_[lVar10].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (v->files_[lVar10].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar7) {
      p_Var2 = &v->files_[lVar10].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ;
      uVar11 = 0;
      do {
        pSVar3 = (Snapshot *)(ppFVar7[uVar11]->largest).rep_._M_string_length;
        if (pSVar3 == (Snapshot *)0x0) {
LAB_0066d1a0:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_48 = (ppFVar7[uVar11]->largest).rep_._M_dataplus._M_p;
        sVar4 = (ikey->rep_)._M_string_length;
        pSStack_40 = pSVar3;
        if (sVar4 == 0) goto LAB_0066d1a0;
        local_58 = (Table *)(ikey->rep_)._M_dataplus._M_p;
        local_50 = sVar4;
        iVar6 = (*(pIVar1->super_Comparator)._vptr_Comparator[2])
                          (pIVar1,(ReadOptions *)&local_48,&local_58);
        pFVar5 = (p_Var2->_M_impl).super__Vector_impl_data._M_start[uVar11];
        if (iVar6 < 1) {
          local_80 = local_80 + pFVar5->file_size;
        }
        else {
          pSVar3 = (Snapshot *)(pFVar5->smallest).rep_._M_string_length;
          if (pSVar3 == (Snapshot *)0x0) goto LAB_0066d1a0;
          local_48 = (pFVar5->smallest).rep_._M_dataplus._M_p;
          sVar4 = (ikey->rep_)._M_string_length;
          pSStack_40 = pSVar3;
          if (sVar4 == 0) goto LAB_0066d1a0;
          local_58 = (Table *)(ikey->rep_)._M_dataplus._M_p;
          local_50 = sVar4;
          iVar6 = (*(pIVar1->super_Comparator)._vptr_Comparator[2])
                            (pIVar1,(ReadOptions *)&local_48,&local_58);
          if (iVar6 < 1) {
            pSStack_40 = (Snapshot *)0x0;
            local_48 = (pointer)0x100;
            pFVar5 = (p_Var2->_M_impl).super__Vector_impl_data._M_start[uVar11];
            pIVar8 = TableCache::NewIterator
                               (this->table_cache_,(ReadOptions *)&local_48,pFVar5->number,
                                pFVar5->file_size,&local_58);
            if (local_58 != (Table *)0x0) {
              pSVar3 = (Snapshot *)(ikey->rep_)._M_string_length;
              if (pSVar3 == (Snapshot *)0x0) goto LAB_0066d1a0;
              local_48 = (ikey->rep_)._M_dataplus._M_p;
              pSStack_40 = pSVar3;
              uVar9 = Table::ApproximateOffsetOf(local_58,(Slice *)&local_48);
              local_80 = local_80 + uVar9;
            }
            if (pIVar8 != (Iterator *)0x0) {
              (*pIVar8->_vptr_Iterator[1])(pIVar8);
            }
          }
          else if (lVar10 != 0) break;
        }
        uVar11 = uVar11 + 1;
        ppFVar7 = (p_Var2->_M_impl).super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(p_Var2->_M_impl).super__Vector_impl_data._M_finish -
                                (long)ppFVar7 >> 3));
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 7) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return local_80;
    }
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}